

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

Ptr __thiscall
hwnet::TCPSocket::SetSendTimeoutCallback
          (TCPSocket *this,milliseconds timeout,SendTimeoutCallback *callback)

{
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __mutex;
  Ptr PVar1;
  undefined1 local_48 [8];
  shared_ptr<hwnet::util::Timer> sp;
  
  __mutex._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(timeout + 0x938);
  std::mutex::lock((mutex *)__mutex._M_pi);
  if ((*(byte *)(timeout + 0x928) & 1) == 0) {
    *(undefined8 *)(timeout + 0xad8) = 0;
    sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         __mutex._M_pi;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)(timeout + 0xae0),
               (nullptr_t)0x0);
    __mutex._M_pi =
         sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((callback == (SendTimeoutCallback *)0x0) ||
       ((in_RCX->super__Function_base)._M_manager == (_Manager_type)0x0)) {
      if (*(long *)(timeout + 0xaa8) == 0) {
        std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_48,
                   (__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)(timeout + 0xa98));
        if (local_48 != (undefined1  [8])0x0) {
          util::Timer::cancel((Timer *)local_48);
          std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)(timeout + 0xa98)
                    );
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sp);
        __mutex = sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      }
    }
    else {
      *(SendTimeoutCallback **)(timeout + 0xad8) = callback;
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)(timeout + 0xae0),
                 in_RCX);
      registerTimer((TCPSocket *)timeout,1);
    }
  }
  std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPSocket,void>
            ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)(timeout + 0x18));
  pthread_mutex_unlock((pthread_mutex_t *)__mutex._M_pi);
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr TCPSocket::SetSendTimeoutCallback(util::milliseconds timeout, const SendTimeoutCallback &callback) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(!this->closed) {	
		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;

		if(timeout > 0 && callback) {
			this->sendTimeout = timeout;
			this->sendTimeoutCallback_ = callback;			
			this->registerTimer(timerSend);
		} else if(this->recvTimeout == 0) {
			if(auto sp = this->timer.lock()) {
				sp->cancel();
				this->timer.reset();
			}		
		}
	}

	return shared_from_this();
}